

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
::increment_slow(btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
                 *this)

{
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar1;
  undefined8 uVar2;
  bool bVar3;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar4;
  btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
  *pbVar5;
  char *__function;
  int iVar6;
  btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_&,_std::pair<const_S2CellId,_S2ShapeIndexCell_*>_*>
  save;
  int iStack_10;
  
  pbVar5 = this->node;
  if (((ulong)pbVar5 & 7) == 0) {
    iVar6 = this->position;
    if (pbVar5[0xb] ==
        (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar5[10] <= iVar6) {
        __assert_fail("position < node->count()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x6f7,
                      "void gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>, std::pair<const S2CellId, S2ShapeIndexCell *> &, std::pair<const S2CellId, S2ShapeIndexCell *> *>::increment_slow() [Node = gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>, Reference = std::pair<const S2CellId, S2ShapeIndexCell *> &, Pointer = std::pair<const S2CellId, S2ShapeIndexCell *> *]"
                     );
      }
      iVar6 = iVar6 + 1;
      while( true ) {
        pbVar5 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 ::child(pbVar5,iVar6);
        this->node = pbVar5;
        if (((ulong)pbVar5 & 7) != 0) break;
        if (pbVar5[0xb] !=
            (btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
             )0x0) {
          this->position = 0;
          return;
        }
        iVar6 = 0;
      }
    }
    else {
      if (iVar6 < (int)(uint)(byte)pbVar5[10]) {
        __assert_fail("position >= node->count()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                      ,0x6ec,
                      "void gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>, std::pair<const S2CellId, S2ShapeIndexCell *> &, std::pair<const S2CellId, S2ShapeIndexCell *> *>::increment_slow() [Node = gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>, Reference = std::pair<const S2CellId, S2ShapeIndexCell *> &, Pointer = std::pair<const S2CellId, S2ShapeIndexCell *> *]"
                     );
      }
      pbVar1 = this->node;
      uVar2 = *(undefined8 *)&this->position;
      pbVar5 = this->node;
      while (((ulong)pbVar5 & 7) == 0) {
        if ((this->position != (uint)(byte)pbVar5[10]) ||
           (bVar3 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                    ::is_root(pbVar5), bVar3)) {
          if (((ulong)this->node & 7) == 0) {
            if (this->position == (uint)(byte)this->node[10]) {
              iStack_10 = (int)uVar2;
              this->position = iStack_10;
              this->node = pbVar1;
            }
            return;
          }
          break;
        }
        pbVar5 = this->node;
        if (((ulong)pbVar5 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
          ;
          goto LAB_0019aed0;
        }
        pbVar4 = btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                 ::child(*(btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                           **)pbVar5,(uint)(byte)pbVar5[8]);
        pbVar5 = this->node;
        if (pbVar4 != pbVar5) {
          __assert_fail("node->parent()->child(node->position()) == node",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                        ,0x6ef,
                        "void gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>, std::pair<const S2CellId, S2ShapeIndexCell *> &, std::pair<const S2CellId, S2ShapeIndexCell *> *>::increment_slow() [Node = gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>>, Reference = std::pair<const S2CellId, S2ShapeIndexCell *> &, Pointer = std::pair<const S2CellId, S2ShapeIndexCell *> *]"
                       );
        }
        if (((ulong)pbVar5 & 7) != 0) break;
        this->position = (uint)(byte)pbVar5[8];
        pbVar5 = *(btree_node<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>
                   **)pbVar5;
        this->node = pbVar5;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *, unsigned char, absl::container_internal::slot_type<S2CellId, S2ShapeIndexCell *>, gtl::internal_btree::btree_node<gtl::internal_btree::map_params<S2CellId, S2ShapeIndexCell *, std::less<S2CellId>, std::allocator<std::pair<const S2CellId, S2ShapeIndexCell *>>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
  ;
LAB_0019aed0:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,__function);
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
  if (node->leaf()) {
    assert(position >= node->count());
    btree_iterator save(*this);
    while (position == node->count() && !node->is_root()) {
      assert(node->parent()->child(node->position()) == node);
      position = node->position();
      node = node->parent();
    }
    if (position == node->count()) {
      *this = save;
    }
  } else {
    assert(position < node->count());
    node = node->child(position + 1);
    while (!node->leaf()) {
      node = node->child(0);
    }
    position = 0;
  }
}